

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

void __thiscall djb::tab::extract_ndf(tab *this,brdf *brdf)

{
  int iVar1;
  reference __v;
  size_t sVar2;
  double *pdVar3;
  const_reference pvVar4;
  int iVar5;
  float_t fVar6;
  float_t fVar7;
  float fVar8;
  float fVar9;
  float_t fVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  float local_214;
  float local_1b0;
  float local_1ac;
  float local_1a8;
  float local_1a4;
  float local_1a0;
  float_t p2;
  float_t p1;
  int local_194;
  int i;
  int j;
  vector<double,_std::allocator<double>_> v;
  undefined1 local_16c [4];
  float_t dp;
  vec3 wm;
  float_t z_m;
  float_t zm;
  float_t pm;
  float_t tm;
  float_t u2_m;
  float_t u1_m;
  int j1;
  int j2;
  double kji_tmp;
  undefined1 local_130 [4];
  float_t frp_i;
  value_type frp;
  vec3 wi_1;
  float_t z_i_1;
  float_t zi_1;
  float_t pi_1;
  float_t ti_1;
  float_t u2_i;
  float_t u1_i;
  int i1_1;
  int i2_1;
  pair<djb::vec3,_djb::vec3> local_d4;
  undefined1 local_bc [8];
  vec3 wi;
  float_t z_i;
  float_t zi;
  float_t pi;
  float_t ti;
  float_t u2;
  float_t u1;
  int i1;
  int i2;
  vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_> frp_v;
  vector<std::pair<djb::vec3,_djb::vec3>,_std::allocator<std::pair<djb::vec3,_djb::vec3>_>_> io;
  matrix km;
  double du2;
  double du1;
  int h;
  int w;
  brdf *brdf_local;
  tab *this_local;
  
  iVar5 = this->m_zres + -1;
  iVar1 = this->m_pres;
  fVar6 = m_pi();
  fVar7 = m_pi();
  matrix::matrix((matrix *)
                 &io.
                  super__Vector_base<std::pair<djb::vec3,_djb::vec3>,_std::allocator<std::pair<djb::vec3,_djb::vec3>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,iVar5 * iVar1);
  std::vector<std::pair<djb::vec3,_djb::vec3>,_std::allocator<std::pair<djb::vec3,_djb::vec3>_>_>::
  vector((vector<std::pair<djb::vec3,_djb::vec3>,_std::allocator<std::pair<djb::vec3,_djb::vec3>_>_>
          *)&frp_v.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::vector
            ((vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_> *)&i1);
  for (u1 = 0.0; (int)u1 < iVar1; u1 = (float_t)((int)u1 + 1)) {
    for (u2 = 0.0; (int)u2 < iVar5; u2 = (float_t)((int)u2 + 1)) {
      ti = (float)(int)u2 / (float)iVar5;
      fVar8 = (float)(int)u1;
      fVar9 = sqr<float>(&ti);
      fVar10 = m_pi();
      fVar9 = fVar9 * fVar10 * 0.5;
      fVar10 = m_pi();
      fVar8 = (fVar8 / (float)iVar1 + fVar8 / (float)iVar1) * fVar10;
      dVar11 = std::cos((double)(ulong)(uint)fVar9);
      wi.z = SUB84(dVar11,0);
      dVar11 = std::sin((double)(ulong)(uint)fVar9);
      wi.y = SUB84(dVar11,0);
      dVar12 = std::cos((double)(ulong)(uint)fVar8);
      fVar10 = wi.y;
      dVar13 = std::sin((double)(ulong)(uint)fVar8);
      vec3::vec3((vec3 *)local_bc,SUB84(dVar11,0) * SUB84(dVar12,0),fVar10 * SUB84(dVar13,0),wi.z);
      std::pair<djb::vec3,_djb::vec3>::pair<djb::vec3_&,_djb::vec3_&,_true>
                (&local_d4,(vec3 *)local_bc,(vec3 *)local_bc);
      std::
      vector<std::pair<djb::vec3,_djb::vec3>,_std::allocator<std::pair<djb::vec3,_djb::vec3>_>_>::
      push_back((vector<std::pair<djb::vec3,_djb::vec3>,_std::allocator<std::pair<djb::vec3,_djb::vec3>_>_>
                 *)&frp_v.
                    super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_d4);
    }
  }
  (*brdf->_vptr_brdf[3])
            (&i1_1,brdf,
             &frp_v.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
  std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::operator=
            ((vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_> *)&i1,
             (vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_> *)&i1_1);
  std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::~vector
            ((vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_> *)&i1_1);
  for (u1_i = 0.0; (int)u1_i < iVar1; u1_i = (float_t)((int)u1_i + 1)) {
    for (u2_i = 0.0; (int)u2_i < iVar5; u2_i = (float_t)((int)u2_i + 1)) {
      ti_1 = (float)(int)u2_i / (float)iVar5;
      fVar8 = (float)(int)u1_i;
      fVar9 = sqr<float>(&ti_1);
      fVar10 = m_pi();
      fVar9 = fVar9 * fVar10 * 0.5;
      fVar10 = m_pi();
      fVar8 = (fVar8 / (float)iVar1 + fVar8 / (float)iVar1) * fVar10;
      dVar11 = std::cos((double)(ulong)(uint)fVar9);
      dVar12 = std::sin((double)(ulong)(uint)fVar9);
      dVar13 = std::cos((double)(ulong)(uint)fVar8);
      dVar14 = std::sin((double)(ulong)(uint)fVar8);
      vec3::vec3((vec3 *)((long)&frp._M_data + 4),SUB84(dVar12,0) * SUB84(dVar13,0),
                 SUB84(dVar12,0) * SUB84(dVar14,0),SUB84(dVar11,0));
      __v = std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::operator[]
                      ((vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_> *)&i1,
                       (long)((int)u2_i + iVar5 * (int)u1_i));
      std::valarray<float>::valarray((valarray<float> *)local_130,__v);
      fVar8 = std::valarray<float>::sum((valarray<float> *)local_130);
      sVar2 = std::valarray<float>::size((valarray<float> *)local_130);
      local_214 = (float)sVar2;
      kji_tmp._4_4_ = fVar8 / local_214;
      _j1 = (double)kji_tmp._4_4_ * ((double)fVar6 / (double)iVar5) *
            (((double)fVar7 * 2.0) / (double)iVar1);
      for (u1_m = 0.0; (int)u1_m < iVar1; u1_m = (float_t)((int)u1_m + 1)) {
        for (u2_m = 0.0; (int)u2_m < iVar5; u2_m = (float_t)((int)u2_m + 1)) {
          tm = (float)(int)u2_m / (float)iVar5;
          fVar8 = (float)(int)u1_m;
          fVar9 = sqr<float>(&tm);
          fVar10 = m_pi();
          fVar9 = fVar9 * fVar10 * 0.5;
          fVar10 = m_pi();
          fVar8 = (fVar8 / (float)iVar1 + fVar8 / (float)iVar1) * fVar10;
          dVar11 = std::cos((double)(ulong)(uint)fVar9);
          wm.z = SUB84(dVar11,0);
          dVar11 = std::sin((double)(ulong)(uint)fVar9);
          wm.y = SUB84(dVar11,0);
          dVar12 = std::cos((double)(ulong)(uint)fVar8);
          fVar10 = wm.y;
          dVar13 = std::sin((double)(ulong)(uint)fVar8);
          vec3::vec3((vec3 *)local_16c,SUB84(dVar11,0) * SUB84(dVar12,0),fVar10 * SUB84(dVar13,0),
                     wm.z);
          v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_ = dot((vec3 *)local_16c,(vec3 *)((long)&frp._M_data + 4));
          fVar8 = sat<float>((float *)((long)&v.super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl.super__Vector_impl_data._M_end_of_storage + 4)
                            );
          dVar11 = _j1 * (double)(tm * fVar8 * wm.y);
          pdVar3 = matrix::operator()((matrix *)
                                      &io.
                                       super__Vector_base<std::pair<djb::vec3,_djb::vec3>,_std::allocator<std::pair<djb::vec3,_djb::vec3>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                      (int)u2_m + iVar5 * (int)u1_m,(int)u2_i + iVar5 * (int)u1_i);
          *pdVar3 = dVar11;
        }
      }
      std::valarray<float>::~valarray((valarray<float> *)local_130);
    }
  }
  matrix::eigenvector((vector<double,_std::allocator<double>_> *)&i,
                      (matrix *)
                      &io.
                       super__Vector_base<std::pair<djb::vec3,_djb::vec3>,_std::allocator<std::pair<djb::vec3,_djb::vec3>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,4);
  for (local_194 = 0; local_194 < iVar1; local_194 = local_194 + 1) {
    for (p1 = 0.0; (int)p1 < iVar5; p1 = (float_t)((int)p1 + 1)) {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)&i,
                          (long)((int)p1 + iVar5 * local_194));
      p2 = (float_t)*pvVar4;
      std::vector<float,_std::allocator<float>_>::push_back(&this->m_ndf,&p2);
    }
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)&i,
                        (long)(local_194 * iVar5 + -2 + iVar5));
    local_1a0 = (float)*pvVar4;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)&i,
                        (long)(local_194 * iVar5 + -1 + iVar5));
    local_1a4 = (float)*pvVar4;
    local_1ac = 0.0;
    local_1b0 = (local_1a4 + local_1a4) - local_1a0;
    local_1a8 = max<float>(&local_1ac,&local_1b0);
    std::vector<float,_std::allocator<float>_>::push_back(&this->m_ndf,&local_1a8);
  }
  fprintf(_stdout,"djb_verbose: NDF extraction complete\n");
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&i);
  std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::~vector
            ((vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_> *)&i1);
  std::vector<std::pair<djb::vec3,_djb::vec3>,_std::allocator<std::pair<djb::vec3,_djb::vec3>_>_>::
  ~vector((vector<std::pair<djb::vec3,_djb::vec3>,_std::allocator<std::pair<djb::vec3,_djb::vec3>_>_>
           *)&frp_v.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  matrix::~matrix((matrix *)
                  &io.
                   super__Vector_base<std::pair<djb::vec3,_djb::vec3>,_std::allocator<std::pair<djb::vec3,_djb::vec3>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void tab::extract_ndf(const brdf &brdf)
{
	const int w = m_zres - 1;
	const int h = m_pres;
	const double du1 = (double)m_pi() / w;
	const double du2 = 2 * (double)m_pi() / h;
	matrix km(w * h);
	std::vector<brdf::io_pair> io;
	std::vector<brdf::value_type> frp_v;

	// evaluate all directions
	for (int i2 = 0; i2 < h; ++i2)
	for (int i1 = 0; i1 < w; ++i1) {
		float_t u1 = (float_t)i1 / w; // in [0, 1)
		float_t u2 = (float_t)i2 / h; // in [0, 1)
		float_t ti = sqr(u1) * m_pi() / 2; // in [0, pi/2)
		float_t pi = u2 * 2 * m_pi(); // in [0, 2pi)
		float_t zi = cos(ti), z_i = sin(ti);
		vec3 wi = vec3(z_i * cos(pi), z_i * sin(pi), zi);

		io.push_back(brdf::io_pair(wi, wi));
	}
	frp_v = brdf.eval_batch(io);

	// build kernel
	for (int i2 = 0; i2 < h; ++i2)
	for (int i1 = 0; i1 < w; ++i1) {
		float_t u1_i = (float_t)i1 / w; // in [0, 1)
		float_t u2_i = (float_t)i2 / h; // in [0, 1)
		float_t ti = sqr(u1_i) * m_pi() / 2; // in [0, pi/2)
		float_t pi = u2_i * 2 * m_pi(); // in [0, 2pi)
		float_t zi = cos(ti), z_i = sin(ti);
		vec3 wi = vec3(z_i * cos(pi), z_i * sin(pi), zi);
		brdf::value_type frp = frp_v[i1 + w * i2];
		float_t frp_i = frp.sum() / frp.size();//dot(frp, vec3(0.2126, 0.7152, 0.0722));
		double kji_tmp = (double)frp_i * du1 * du2;

		for (int j2 = 0; j2 < h; ++j2)
		for (int j1 = 0; j1 < w; ++j1) {
			float_t u1_m = (float_t)j1 / w; // in [0, 1)
			float_t u2_m = (float_t)j2 / h; // in [0, 1)
			float_t tm = sqr(u1_m) * m_pi() / 2; // in [0, pi/2)
			float_t pm = u2_m * 2 * m_pi();      // in [0, 2pi)
			float_t zm = cos(tm), z_m = sin(tm);
			vec3 wm = vec3(z_m * cos(pm), z_m * sin(pm), zm);
			float_t dp = sat(dot(wm, wi));

			km(j1 + w * j2, i1 + w * i2) = kji_tmp * (double)(u1_m * dp * z_m);
		}
	}

	// compute slope pdf
	const std::vector<double> v = km.eigenvector(4);

	// store NDF
	for (int j = 0; j < h; ++j) {
		for (int i = 0; i < w; ++i) {
			m_ndf.push_back(v[i + w * j]);
		}
		float_t p1 = v[j * w + w - 2];
		float_t p2 = v[j * w + w - 1];
		m_ndf.push_back(max((float_t)0, 2 * p2 - p1));
	}

#ifndef NVERBOSE
	DJB_LOG("djb_verbose: NDF extraction complete\n");
#endif
}